

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

uint Abc_HashKey2(Abc_Obj_t *p0,Abc_Obj_t *p1,int TableSize)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0x38f;
  if (((ulong)p0 & 1) == 0) {
    uVar2 = 0;
  }
  uVar1 = 0x161;
  if (((ulong)p1 & 1) == 0) {
    uVar1 = 0;
  }
  return (uVar1 ^ uVar2 ^ *(int *)(((ulong)p0 & 0xfffffffffffffffe) + 0x10) * 0x1f01 ^
         *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x10) * 0xb9b) % (uint)TableSize;
}

Assistant:

static unsigned Abc_HashKey2( Abc_Obj_t * p0, Abc_Obj_t * p1, int TableSize ) 
{
    unsigned Key = 0;
    Key ^= Abc_ObjRegular(p0)->Id * 7937;
    Key ^= Abc_ObjRegular(p1)->Id * 2971;
    Key ^= Abc_ObjIsComplement(p0) * 911;
    Key ^= Abc_ObjIsComplement(p1) * 353;
    return Key % TableSize;
}